

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutnode.h
# Opt level: O3

void __thiscall rengine::LayoutEngine::updateLayout(LayoutEngine *this,Node *parentNode)

{
  float fVar1;
  byte bVar2;
  Node *pNVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  rect2d rect;
  float local_78;
  float local_58;
  float local_30;
  float local_2c;
  
  bVar2 = this->field_0x28 & 3;
  if (bVar2 < 2) {
    fVar13 = this->cellWidth;
    if (((fVar13 == 0.0) && (!NAN(fVar13))) &&
       (((this->width == 0.0 && (!NAN(this->width))) || (this->columnCount < 1)))) {
      __assert_fail("cellWidth != 0 || (width != 0 && columnCount > 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                    ,0xdb,"void rengine::LayoutEngine::updateLayout(Node *)");
    }
    fVar17 = this->cellHeight;
    if ((fVar17 != 0.0) || (NAN(fVar17))) {
      fVar11 = ABS(fVar13);
      local_30 = *(float *)(&DAT_0013c1f0 + (ulong)(0.0 < fVar13) * 4);
      fVar13 = ABS(fVar17);
    }
    else {
      fVar17 = this->height;
      if (((fVar17 == 0.0) && (!NAN(fVar17))) || (iVar7 = this->rowCount, iVar7 < 1)) {
        __assert_fail("cellHeight != 0 || (height != 0 && rowCount > 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                      ,0xdc,"void rengine::LayoutEngine::updateLayout(Node *)");
      }
      fVar13 = this->margin * -2.0;
      fVar11 = ((ABS(this->width) + fVar13) - (float)(this->columnCount + -1) * this->spacing) /
               (float)this->columnCount;
      local_30 = *(float *)(&DAT_0013c1f0 + (ulong)(0.0 < this->width) * 4);
      fVar13 = ((ABS(fVar17) + fVar13) - (float)(iVar7 + -1) * this->spacing) / (float)iVar7;
    }
    iVar7 = 0x7fffffff;
    if (0 < (&this->columnCount)[bVar2 != 0]) {
      iVar7 = (&this->columnCount)[bVar2 != 0];
    }
    pNVar3 = parentNode->m_child;
    if (pNVar3 != (Node *)0x0) {
      fVar17 = *(float *)(&DAT_00139b90 + (ulong)(fVar17 < 0.0) * 4);
      iVar8 = 0;
      do {
        if ((pNVar3->field_0x30 & 0x40) != 0) {
          if ((this->field_0x28 & 3) == 0) {
            iVar6 = iVar8 / iVar7;
            iVar4 = iVar8 % iVar7;
          }
          else {
            iVar4 = iVar8 / iVar7;
            iVar6 = iVar8 % iVar7;
          }
          fVar12 = ((float)iVar4 * this->spacing + (float)iVar4 * fVar11 + this->margin) * local_30
                   + this->x;
          fVar15 = ((float)iVar6 * this->spacing + (float)iVar6 * fVar13 + this->margin) * fVar17 +
                   this->y;
          fVar10 = fVar11 * local_30 + fVar12;
          fVar14 = fVar17 * fVar13 + fVar15;
          fVar1 = fVar10;
          if (fVar12 <= fVar10) {
            fVar1 = fVar12;
          }
          fVar16 = fVar14;
          if (fVar15 <= fVar14) {
            fVar16 = fVar15;
          }
          rect.tl.y = fVar16;
          rect.tl.x = fVar1;
          if (fVar10 <= fVar12) {
            fVar10 = fVar12;
          }
          if (fVar14 <= fVar15) {
            fVar14 = fVar15;
          }
          rect.br.y = fVar14;
          rect.br.x = fVar10;
          RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar3,rect);
          iVar8 = iVar8 + 1;
        }
        pNVar3 = Node::sibling(pNVar3);
      } while (pNVar3 != (Node *)0x0);
    }
  }
  else {
    if (bVar2 == 2) {
      fVar13 = this->width;
      fVar17 = (float)(~-(uint)(fVar13 < 0.0) & 0x3f800000 | -(uint)(fVar13 < 0.0) & 0xbf800000);
      uVar9 = -(uint)(this->height < 0.0);
      local_58 = (float)(~uVar9 & 0x3f800000 | uVar9 & 0xbf800000);
      iVar7 = this->columnCount;
    }
    else {
      fVar13 = this->height;
      fVar17 = (float)(~-(uint)(fVar13 < 0.0) & 0x3f800000 | -(uint)(fVar13 < 0.0) & 0xbf800000);
      uVar9 = -(uint)(this->width < 0.0);
      local_58 = (float)(~uVar9 & 0x3f800000 | uVar9 & 0xbf800000);
      iVar7 = this->rowCount;
    }
    iVar8 = 0x7fffffff;
    if (0 < iVar7) {
      iVar8 = iVar7;
    }
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      fVar11 = this->margin * fVar17;
      fVar13 = fVar13 - (fVar11 + fVar11);
    }
    else {
      fVar13 = fVar17 * INFINITY;
    }
    pNVar3 = parentNode->m_child;
    if (pNVar3 != (Node *)0x0) {
      local_78 = local_58 * this->margin;
      fVar11 = this->margin * fVar17;
      iVar7 = 0;
      local_2c = 0.0;
      do {
        if ((pNVar3->field_0x30 & 0x40) == 0) {
          pNVar3 = Node::sibling(pNVar3);
        }
        else {
          bVar2 = this->field_0x28 & 3;
          uVar5 = (ulong)(bVar2 != 2);
          fVar10 = (*(float *)((long)&pNVar3[1].super_SignalEmitter._vptr_SignalEmitter +
                              uVar5 * 4 + 4) - *(float *)(&pNVar3->field_0x34 + uVar5 * 4)) * fVar17
                   + fVar11;
          if (iVar7 != 0 && (iVar8 <= iVar7 || fVar13 * fVar17 < fVar17 * fVar10)) {
            local_78 = local_78 + (this->spacing + local_2c) * local_58;
            fVar11 = this->margin * fVar17;
            iVar7 = 0;
          }
          else {
            if (bVar2 == 2) {
              fVar14 = fVar11;
              if (this->x + fVar17 <= 0.0) {
                fVar14 = fVar11 - (*(float *)((long)&pNVar3[1].super_SignalEmitter.
                                                     _vptr_SignalEmitter + 4) -
                                  *(float *)&pNVar3->field_0x34);
              }
              fVar11 = *(float *)&pNVar3[1].super_SignalEmitter.m_buckets -
                       *(float *)&pNVar3[1].super_SignalEmitter._vptr_SignalEmitter;
              fVar1 = fVar11;
              if (fVar11 <= local_2c) {
                fVar1 = local_2c;
              }
              uVar9 = -(uint)(0.0 < this->y + local_58);
              fVar11 = (float)(uVar9 & (uint)local_78 | ~uVar9 & (uint)(local_78 - fVar11));
              local_2c = fVar1;
            }
            else {
              if (this->y + fVar17 <= 0.0) {
                fVar11 = fVar11 - (*(float *)&pNVar3[1].super_SignalEmitter.m_buckets -
                                  *(float *)&pNVar3[1].super_SignalEmitter._vptr_SignalEmitter);
              }
              fVar14 = *(float *)((long)&pNVar3[1].super_SignalEmitter._vptr_SignalEmitter + 4) -
                       *(float *)&pNVar3->field_0x34;
              fVar1 = fVar14;
              if (fVar14 <= local_2c) {
                fVar1 = local_2c;
              }
              uVar9 = -(uint)(0.0 < this->x + local_58);
              fVar14 = (float)(uVar9 & (uint)local_78 | ~uVar9 & (uint)(local_78 - fVar14));
              local_2c = fVar1;
            }
            RectangleNodeBase::setPosition((RectangleNodeBase *)pNVar3,fVar14,fVar11);
            iVar7 = iVar7 + 1;
            fVar11 = this->spacing * fVar17 + fVar10;
            pNVar3 = Node::sibling(pNVar3);
          }
        }
      } while (pNVar3 != (Node *)0x0);
    }
  }
  return;
}

Assistant:

void LayoutEngine::updateLayout(Node *parentNode)
{
    if (layoutType == Grid_Horizontal || layoutType == Grid_Vertical) {
        assert(cellWidth != 0 || (width != 0 && columnCount > 0));
        assert(cellHeight != 0 || (height != 0 && rowCount > 0));

        int index = 0;

        float cw, ch, xSign, ySign;

        if (cellHeight != 0) {
             cw = std::abs(cellWidth);
             xSign = cellWidth > 0 ? 1 : -1;
        } else {
            cw = (std::abs(width) - 2 * margin - (columnCount - 1) * spacing) / columnCount;
            xSign = width > 0 ? 1 : -1;
        }

        if (cellHeight != 0) {
            ch = std::abs(cellHeight);
            ySign = cellHeight < 0 ? -1 : 1;
        } else {
            ch = (std::abs(height) - 2 * margin - (rowCount - 1) * spacing) / rowCount;
            ySign = height < 0 ? -1 : 1;
        }

        logd << (layoutType == Grid_Horizontal ? "horizontal" : "vertical")
             << "-grid: cell=" << cw << "x" << ch
             << ", dim=" << width << "x" << height << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        const int itemsPer = layoutType == Grid_Horizontal
                             ? (columnCount > 0 ? columnCount : std::numeric_limits<int>::max())
                             : (rowCount > 0 ? rowCount : std::numeric_limits<int>::max());
        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                int r, c;
                if (layoutType == Grid_Horizontal) {
                    r = index / itemsPer;
                    c = index % itemsPer;
                } else {
                    r = index % itemsPer;
                    c = index / itemsPer;
                }

                rectNode->setGeometry(rect2d::fromXywh(x + xSign * (margin + c * cw + c * spacing),
                                                       y + ySign * (margin + r * ch + r * spacing),
                                                       xSign * cw,
                                                       ySign * ch).normalized());
                ++index;
            }
            node = node->sibling();
        }

    } else {

        int index = 0;
        int itemLimit;
        float sizeLimit;

        float posSign, offsetSign;

        if (layoutType == Flow_Horizontal) {
            posSign = width < 0 ? -1 : 1;
            offsetSign = height < 0 ? -1 : 1;
            itemLimit = columnCount > 0 ? columnCount : std::numeric_limits<int>::max();
            sizeLimit = width != 0 ? width - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        } else {
            posSign = height < 0 ? -1 : 1;
            offsetSign = width < 0 ? -1 : 1;
            itemLimit = rowCount > 0 ? rowCount : std::numeric_limits<int>::max();
            sizeLimit = height != 0 ? height - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        }

        float pos = posSign * margin; // The position to place the node on the current line
        float offset = offsetSign * margin; // The position in the direction normal to the pos
        float offsetIncrement = 0;

        logd << (layoutType == Flow_Horizontal ? "horizontal" : "vertical")
             << "-flow: itemLimit=" << itemLimit << ", sizeLimit=" << sizeLimit
             << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                float dim = layoutType == Flow_Horizontal ? rectNode->width() : rectNode->height();
                float end = pos + posSign * dim;
                bool fitsOnLine = (posSign * end <= posSign * sizeLimit && index < itemLimit);
                logd << " - pos=" << pos << ", dim=" << dim << ", end=" << end  << ", index=" << index << ", fitsOnLine=" << fitsOnLine << std::endl;

                if (fitsOnLine || index == 0) {
                    if (layoutType == Flow_Horizontal) {
                        offsetIncrement = std::max(offsetIncrement, rectNode->height());
                        rectNode->setPosition(x + posSign > 0 ? pos : pos - rectNode->width(),
                                              y + offsetSign > 0 ? offset : offset - rectNode->height());
                    } else {
                        offsetIncrement = std::max(offsetIncrement, rectNode->width());
                        rectNode->setPosition(x + offsetSign > 0 ? offset : offset - rectNode->width(),
                                              y + posSign > 0 ? pos : pos - rectNode->height());
                    }
                    ++index;
                    pos = end + posSign * spacing;
                    node = node->sibling();
                } else {
                    // If it doesn't fit, wrap to the next line..
                    offset += offsetSign * (offsetIncrement + spacing);
                    pos = posSign * margin;
                    index = 0;
                }
            } else {
                node = node->sibling();
            }
        }
    }
}